

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O1

size_t ZSTD_count_2segments(BYTE *ip,BYTE *match,BYTE *iEnd,BYTE *mEnd,BYTE *iStart)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong *puVar4;
  ulong *puVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  
  puVar2 = (ulong *)(ip + ((long)mEnd - (long)match));
  if (iEnd <= ip + ((long)mEnd - (long)match)) {
    puVar2 = (ulong *)iEnd;
  }
  puVar4 = (ulong *)ip;
  puVar5 = (ulong *)match;
  if (ip < (ulong *)((long)puVar2 - 7U)) {
    uVar1 = *(ulong *)ip ^ *(ulong *)match;
    uVar8 = 0;
    if (uVar1 != 0) {
      for (; (uVar1 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
      }
    }
    sVar7 = uVar8 >> 3 & 0x1fffffff;
    if (*(ulong *)match == *(ulong *)ip) {
      puVar4 = (ulong *)(ip + 8);
      puVar5 = (ulong *)(match + 8);
      do {
        if ((ulong *)((long)puVar2 - 7U) <= puVar4) goto LAB_00462cea;
        uVar8 = *puVar5;
        uVar1 = *puVar4;
        uVar6 = uVar1 ^ uVar8;
        uVar3 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        sVar7 = (long)puVar4 + ((uVar3 >> 3 & 0x1fffffff) - (long)ip);
        puVar4 = puVar4 + 1;
        puVar5 = puVar5 + 1;
      } while (uVar8 == uVar1);
    }
  }
  else {
LAB_00462cea:
    if ((puVar4 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar5 == (int)*puVar4)) {
      puVar4 = (ulong *)((long)puVar4 + 4);
      puVar5 = (ulong *)((long)puVar5 + 4);
    }
    if ((puVar4 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar5 == (short)*puVar4)) {
      puVar4 = (ulong *)((long)puVar4 + 2);
      puVar5 = (ulong *)((long)puVar5 + 2);
    }
    if (puVar4 < puVar2) {
      puVar4 = (ulong *)((long)puVar4 + (ulong)((char)*puVar5 == (char)*puVar4));
    }
    sVar7 = (long)puVar4 - (long)ip;
  }
  if (match + sVar7 == mEnd) {
    puVar4 = (ulong *)(ip + sVar7);
    puVar2 = puVar4;
    if (puVar4 < iEnd + -7) {
      uVar1 = *puVar4 ^ *(ulong *)iStart;
      uVar8 = 0;
      if (uVar1 != 0) {
        for (; (uVar1 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      uVar8 = uVar8 >> 3 & 0x1fffffff;
      if (*(ulong *)iStart == *puVar4) {
        iStart = iStart + 8;
        do {
          puVar2 = puVar2 + 1;
          if (iEnd + -7 <= puVar2) goto LAB_00462db1;
          uVar1 = *(ulong *)iStart;
          uVar3 = *puVar2 ^ uVar1;
          uVar8 = 0;
          if (uVar3 != 0) {
            for (; (uVar3 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
          uVar8 = (long)puVar2 + ((uVar8 >> 3 & 0x1fffffff) - (long)puVar4);
          iStart = (BYTE *)((long)iStart + 8);
        } while (uVar1 == *puVar2);
      }
    }
    else {
LAB_00462db1:
      if ((puVar2 < iEnd + -3) && ((int)*(ulong *)iStart == (int)*puVar2)) {
        puVar2 = (ulong *)((long)puVar2 + 4);
        iStart = (BYTE *)((long)iStart + 4);
      }
      if ((puVar2 < iEnd + -1) && ((short)*(ulong *)iStart == (short)*puVar2)) {
        puVar2 = (ulong *)((long)puVar2 + 2);
        iStart = (BYTE *)((long)iStart + 2);
      }
      if (puVar2 < iEnd) {
        puVar2 = (ulong *)((long)puVar2 + (ulong)((char)*(ulong *)iStart == (char)*puVar2));
      }
      uVar8 = (long)puVar2 - (long)puVar4;
    }
    sVar7 = sVar7 + uVar8;
  }
  return sVar7;
}

Assistant:

MEM_STATIC size_t
ZSTD_count_2segments(const BYTE* ip, const BYTE* match,
                     const BYTE* iEnd, const BYTE* mEnd, const BYTE* iStart)
{
    const BYTE* const vEnd = MIN( ip + (mEnd - match), iEnd);
    size_t const matchLength = ZSTD_count(ip, match, vEnd);
    if (match + matchLength != mEnd) return matchLength;
    DEBUGLOG(7, "ZSTD_count_2segments: found a 2-parts match (current length==%zu)", matchLength);
    DEBUGLOG(7, "distance from match beginning to end dictionary = %zi", mEnd - match);
    DEBUGLOG(7, "distance from current pos to end buffer = %zi", iEnd - ip);
    DEBUGLOG(7, "next byte : ip==%02X, istart==%02X", ip[matchLength], *iStart);
    DEBUGLOG(7, "final match length = %zu", matchLength + ZSTD_count(ip+matchLength, iStart, iEnd));
    return matchLength + ZSTD_count(ip+matchLength, iStart, iEnd);
}